

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void fl_set_spot(int font,int size,int X,int Y,int W,int H,Fl_Window *win)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *__ptr;
  bool bVar4;
  int missing_count;
  char *def_string;
  char **missing_list;
  
  if ((fl_xim_ic != (XIC)0x0) && ((fl_is_over_the_spot & 1) != 0)) {
    if ((spot.x != X) || (bVar1 = false, spot.y != Y)) {
      bVar1 = true;
      spot.x = (short)X;
      spot.y = (short)Y;
      spot.height = (unsigned_short)H;
      spot.width = (unsigned_short)W;
    }
    if ((spotf == font) && (spots == size)) {
      __ptr = (char *)0x0;
      bVar4 = false;
    }
    else {
      spotf = font;
      spots = size;
      if (fl_set_spot::fs != (XFontSet)0x0) {
        XFreeFontSet(fl_display);
      }
      pcVar2 = fl_get_font_xfld(font,size);
      bVar4 = pcVar2 == (char *)0x0;
      __ptr = "-misc-fixed-*";
      if (!bVar4) {
        __ptr = pcVar2;
      }
      fl_set_spot::fs =
           (XFontSet)XCreateFontSet(fl_display,__ptr,&missing_list,&missing_count,&def_string);
      bVar1 = true;
    }
    if (fl_xim_ic != fl_set_spot::ic) {
      bVar1 = true;
      fl_set_spot::ic = fl_xim_ic;
    }
    if (__ptr != (char *)0x0 && !bVar4) {
      free(__ptr);
    }
    if (bVar1) {
      uVar3 = XVaCreateNestedList(0,"spotLocation",&spot,"fontSet",fl_set_spot::fs,0);
      XSetICValues(fl_xim_ic,"preeditAttributes",uVar3,0);
      XFree(uVar3);
    }
  }
  return;
}

Assistant:

void fl_set_spot(int font, int size, int X, int Y, int W, int H, Fl_Window *win)
{
  int change = 0;
  XVaNestedList preedit_attr;
  static XFontSet fs = NULL;
  char **missing_list;
  int missing_count;
  char *def_string;
  char *fnt = NULL;
  bool must_free_fnt =true;

  static XIC ic = NULL;

  if (!fl_xim_ic || !fl_is_over_the_spot) return;
  //XSetICFocus(fl_xim_ic);
  if (X != spot.x || Y != spot.y) {
    spot.x = X;
    spot.y = Y;
    spot.height = H;
    spot.width = W;
    change = 1;
  }
  if (font != spotf || size != spots) {
    spotf = font;
    spots = size;
    change = 1;
    if (fs) {
      XFreeFontSet(fl_display, fs);
    }
#if USE_XFT

#if defined(__GNUC__)
// FIXME: warning XFT support here
#endif /*__GNUC__*/

    fnt = NULL; // fl_get_font_xfld(font, size);
    if (!fnt) {fnt = (char*)"-misc-fixed-*";must_free_fnt=false;}
    fs = XCreateFontSet(fl_display, fnt, &missing_list,
                        &missing_count, &def_string);
#else
    fnt = fl_get_font_xfld(font, size);
    if (!fnt) {fnt = (char*)"-misc-fixed-*";must_free_fnt=false;}
    fs = XCreateFontSet(fl_display, fnt, &missing_list,
                        &missing_count, &def_string);
#endif
  }
  if (fl_xim_ic != ic) {
    ic = fl_xim_ic;
    change = 1;
  }

  if (fnt && must_free_fnt) free(fnt);
  if (!change) return;


  preedit_attr = XVaCreateNestedList(0,
                                     XNSpotLocation, &spot,
                                     XNFontSet, fs, NULL);
  XSetICValues(fl_xim_ic, XNPreeditAttributes, preedit_attr, NULL);
  XFree(preedit_attr);
}